

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O0

int __thiscall
CVmFileSource::clone(CVmFileSource *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  osfildef *poVar1;
  osfildef *fpdup;
  CVmFileSource *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffe0;
  undefined4 local_8;
  
  poVar1 = osfdup((osfildef *)__fn,in_stack_ffffffffffffffe0);
  if (poVar1 == (osfildef *)0x0) {
    local_8 = 0;
  }
  else {
    poVar1 = (osfildef *)operator_new(0x10);
    CVmFileSource(in_stack_ffffffffffffffd0,poVar1);
    local_8 = (int)poVar1;
  }
  return local_8;
}

Assistant:

virtual CVmDataSource *clone(VMG_ const char *mode)
    {
        /* duplicate our underlying file handle */
        osfildef *fpdup = osfdup(fp, mode);
        if (fpdup == 0)
            return 0;

        /* return a new source wrapping the duplicated file handle */
        return new CVmFileSource(fpdup);
    }